

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sdtFunc.h
# Opt level: O1

void SDT::commonCal(TreeNode *treeNode,SDTNode *fa,SDTNode *now,string *code)

{
  pointer *pppSVar1;
  int line;
  iterator __position;
  uint uVar2;
  uint uVar3;
  SDTNode *pSVar4;
  const_iterator cVar5;
  uint *puVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  uint __val;
  uint uVar10;
  string *res;
  char *__end;
  string p;
  string __str;
  undefined1 local_e0 [32];
  string local_c0;
  string local_a0;
  TreeNode *local_80;
  string *local_78;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pSVar4 = (SDTNode *)operator_new(0x40);
  (pSVar4->sons).super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pSVar4->sons).super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pSVar4->sons).super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pSVar4->_vptr_SDTNode = (_func_int **)&PTR_dfs_001265b0;
  pSVar4[1]._vptr_SDTNode =
       (_func_int **)
       &pSVar4[1].sons.super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>._M_impl.
        super__Vector_impl_data._M_finish;
  pSVar4[1].sons.super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(undefined1 *)
   &pSVar4[1].sons.super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>._M_impl.
    super__Vector_impl_data._M_finish = 0;
  __position._M_current =
       (now->sons).super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_e0._0_8_ = pSVar4;
  if (__position._M_current ==
      (now->sons).super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<SDT::SDTNode*,std::allocator<SDT::SDTNode*>>::_M_realloc_insert<SDT::SDTNode*>
              ((vector<SDT::SDTNode*,std::allocator<SDT::SDTNode*>> *)&now->sons,__position,
               (SDTNode **)local_e0);
  }
  else {
    *__position._M_current = pSVar4;
    pppSVar1 = &(now->sons).super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppSVar1 = *pppSVar1 + 1;
  }
  (**pSVar4->_vptr_SDTNode)
            (pSVar4,resultTree.super__Vector_base<TreeNode,_std::allocator<TreeNode>_>._M_impl.
                    super__Vector_impl_data._M_start +
                    (treeNode->sons).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[3],now);
  cVar5 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                  *)funcs_abi_cxx11_,
                 &resultTree.super__Vector_base<TreeNode,_std::allocator<TreeNode>_>._M_impl.
                  super__Vector_impl_data._M_start
                  [(treeNode->sons).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[1]].attr);
  if (cVar5._M_node == (_Base_ptr)(funcs_abi_cxx11_ + 8)) {
    line = treeNode->lineNum;
    std::operator+(&local_50,"Function not declared ",
                   &resultTree.super__Vector_base<TreeNode,_std::allocator<TreeNode>_>._M_impl.
                    super__Vector_impl_data._M_start
                    [(treeNode->sons).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[1]].attr);
    ERROR(line,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == &local_50.field_2) {
      return;
    }
  }
  else {
    local_78 = DAT_00127448;
    __val = 0;
    local_80 = treeNode;
    if (q_abi_cxx11_ != DAT_00127448) {
      res = q_abi_cxx11_;
      do {
        local_e0._0_8_ = local_e0 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"param","");
        local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"_","");
        local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"_","");
        gen((string *)local_e0,&local_a0,&local_c0,res);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
          operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
        }
        if ((SDTNode *)local_e0._0_8_ != (SDTNode *)(local_e0 + 0x10)) {
          operator_delete((void *)local_e0._0_8_,local_e0._16_8_ + 1);
        }
        res = res + 1;
        __val = __val + 1;
      } while (res != local_78);
    }
    puVar6 = (uint *)std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                   *)funcs_abi_cxx11_,
                                  &resultTree.
                                   super__Vector_base<TreeNode,_std::allocator<TreeNode>_>._M_impl.
                                   super__Vector_impl_data._M_start
                                   [(local_80->sons).super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_start[1]].attr);
    uVar9 = *puVar6;
    uVar2 = -uVar9;
    if (0 < (int)uVar9) {
      uVar2 = uVar9;
    }
    uVar10 = 1;
    if (9 < uVar2) {
      uVar8 = (ulong)uVar2;
      uVar3 = 4;
      do {
        uVar10 = uVar3;
        uVar7 = (uint)uVar8;
        if (uVar7 < 100) {
          uVar10 = uVar10 - 2;
          goto LAB_00108292;
        }
        if (uVar7 < 1000) {
          uVar10 = uVar10 - 1;
          goto LAB_00108292;
        }
        if (uVar7 < 10000) goto LAB_00108292;
        uVar8 = uVar8 / 10000;
        uVar3 = uVar10 + 4;
      } while (99999 < uVar7);
      uVar10 = uVar10 + 1;
    }
LAB_00108292:
    local_e0._0_8_ = (SDTNode *)(local_e0 + 0x10);
    std::__cxx11::string::_M_construct((ulong)local_e0,(char)uVar10 - (char)((int)uVar9 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)(local_e0._0_8_ + (ulong)(uVar9 >> 0x1f)),uVar10,uVar2);
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"call","");
    uVar9 = 1;
    if (9 < __val) {
      uVar8 = (ulong)__val;
      uVar2 = 4;
      do {
        uVar9 = uVar2;
        uVar10 = (uint)uVar8;
        if (uVar10 < 100) {
          uVar9 = uVar9 - 2;
          goto LAB_00108337;
        }
        if (uVar10 < 1000) {
          uVar9 = uVar9 - 1;
          goto LAB_00108337;
        }
        if (uVar10 < 10000) goto LAB_00108337;
        uVar8 = uVar8 / 10000;
        uVar2 = uVar9 + 4;
      } while (99999 < uVar10);
      uVar9 = uVar9 + 1;
    }
LAB_00108337:
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_c0,(char)uVar9);
    std::__detail::__to_chars_10_impl<unsigned_int>(local_c0._M_dataplus._M_p,uVar9,__val);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"_","");
    gen(&local_a0,&local_c0,&local_70,
        &resultTree.super__Vector_base<TreeNode,_std::allocator<TreeNode>_>._M_impl.
         super__Vector_impl_data._M_start
         [(local_80->sons).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[1]].attr);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
    local_50.field_2._M_allocated_capacity = local_e0._16_8_;
    local_50._M_dataplus._M_p = (pointer)local_e0._0_8_;
    if ((SDTNode *)local_e0._0_8_ == (SDTNode *)(local_e0 + 0x10)) {
      return;
    }
  }
  operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  return;
}

Assistant:

void commonCal(TreeNode &treeNode,SDTNode *fa,SDTNode *now,string &code){
        Elist *elist_1 = new Elist;
        now->sons.push_back(elist_1);
        elist_1->dfs(resultTree[treeNode.sons[3]],now);
        if(!funcs.count(TNAME(1))){
            ERROR(treeNode.lineNum ,"Function not declared "+TNAME(1));
            return;
        }
        int n = 0;
        for(auto &t:q){
            n++;
            gen("param","_","_",t);
        }
        string p = to_string(funcs[TNAME(1)]);
        gen("call",to_string(n),"_",TNAME(1));
    }